

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

Config * jaegertracing::samplers::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int maxOperations;
  int iVar2;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> samplingServerURL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  duration local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  
  if ((configYAML->m_isValid == true) &&
     (((configYAML->m_pNode == (node *)0x0 ||
       (*(char *)**(undefined8 **)configYAML->m_pNode == '\x01')) &&
      (bVar1 = YAML::Node::IsMap(configYAML), bVar1)))) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[5],char[1]>
              (&local_48,(yaml *)configYAML,(Node *)0x22db18,(char (*) [5])0x22c8f9,in_R8);
    local_68._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_28 = utils::yaml::findOrDefault<double,char[6],int>
                         (configYAML,(char (*) [6])0x226bbf,(int *)&local_68);
    utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
              (&local_68,(yaml *)configYAML,(Node *)"samplingServerURL",(char (*) [18])0x22c8f9,
               in_R8);
    local_70.__r._0_4_ = 0;
    maxOperations =
         utils::yaml::findOrDefault<int,char[14],int>
                   (configYAML,(char (*) [14])"maxOperations",(int *)&local_70);
    local_70.__r = (ulong)local_70.__r._4_4_ << 0x20;
    iVar2 = utils::yaml::findOrDefault<int,char[24],int>
                      (configYAML,(char (*) [24])"samplingRefreshInterval",(int *)&local_70);
    local_70.__r = (long)iVar2 * 1000000000;
    Config(__return_storage_ptr__,&local_48,local_28,&local_68,maxOperations,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"remote","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"http://127.0.0.1:5778/sampling","");
    local_70.__r = 60000000000;
    Config(__return_storage_ptr__,&local_48,0.001,&local_68,2000,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_48._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto type =
            utils::yaml::findOrDefault<std::string>(configYAML, "type", "");
        const auto param =
            utils::yaml::findOrDefault<double>(configYAML, "param", -1);
        const auto samplingServerURL = utils::yaml::findOrDefault<std::string>(
            configYAML, "samplingServerURL", "");
        const auto maxOperations =
            utils::yaml::findOrDefault<int>(configYAML, "maxOperations", 0);
        const auto samplingRefreshInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "samplingRefreshInterval", 0));
        return Config(type,
                      param,
                      samplingServerURL,
                      maxOperations,
                      samplingRefreshInterval);
    }